

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O0

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::fillMaximals(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               *this,LiteralList **maximals,DArray<Kernel::Literal_*> *litArr)

{
  bool bVar1;
  Literal *elem;
  DArray<Kernel::Literal_*> *in_RDX;
  List<Kernel::Literal_*> **in_RDI;
  Ordering *unaff_retaddr;
  Literal *lit;
  ReversedIterator rlit;
  ReversedIterator local_28 [2];
  List<Kernel::Literal_*> **lits;
  
  lits = in_RDI;
  Lib::DArray<Kernel::Literal_*>::ReversedIterator::ReversedIterator(local_28,in_RDX);
  while( true ) {
    bVar1 = Lib::DArray<Kernel::Literal_*>::ReversedIterator::hasNext(local_28);
    if (!bVar1) break;
    elem = Lib::DArray<Kernel::Literal_*>::ReversedIterator::next(local_28);
    Lib::List<Kernel::Literal_*>::push(elem,in_RDI);
  }
  Ordering::removeNonMaximal(unaff_retaddr,lits);
  return;
}

Assistant:

void fillMaximals(LiteralList*& maximals, DArray<Literal*>& litArr)
  {
    DArray<Literal*>::ReversedIterator rlit(litArr);
    while(rlit.hasNext()) {
      Literal* lit=rlit.next();
      LiteralList::push(lit,maximals);
    }
    _ord.removeNonMaximal(maximals);
  }